

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O3

void __thiscall hrgls::Message::~Message(Message *this)

{
  Message_private *pMVar1;
  
  pMVar1 = this->m_private;
  if (pMVar1 != (Message_private *)0x0) {
    if (pMVar1->Message != (hrgls_Message)0x0) {
      hrgls_MessageDestroy(pMVar1->Message);
      pMVar1 = this->m_private;
    }
    operator_delete(pMVar1);
    return;
  }
  return;
}

Assistant:

Message::~Message()
  {
    if (m_private) {
      if (m_private->Message) {
        hrgls_MessageDestroy(m_private->Message);
      }
      delete m_private;
    }
  }